

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.h
# Opt level: O1

void __thiscall
testinator::TestRegistry::Register(TestRegistry *this,Test *test,string *testName,string *suiteName)

{
  TestSuiteMap *this_00;
  _func_result_type_void_ptr *p_Var1;
  pointer pcVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar6;
  _Alloc_node __an;
  random_device rd;
  _Alloc_node local_13c0;
  undefined1 local_13b8 [16];
  undefined1 local_13a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13a0 [311];
  
  pcVar2 = (testName->_M_dataplus)._M_p;
  local_13b8._0_8_ = local_13a8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_13b8,pcVar2,pcVar2 + testName->_M_string_length);
  local_13a0[0]._8_8_ = test;
  ::std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,testinator::Test*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
              *)this,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
                      *)local_13b8);
  if ((undefined1 *)local_13b8._0_8_ != local_13a8) {
    operator_delete((void *)local_13b8._0_8_,(long)local_13a8 + 1);
  }
  p_Var1 = (_func_result_type_void_ptr *)(local_13a8 + 8);
  pcVar2 = (testName->_M_dataplus)._M_p;
  local_13b8._0_8_ = test;
  local_13b8._8_8_ = p_Var1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_13b8 + 8),pcVar2,pcVar2 + testName->_M_string_length);
  ::std::
  _Rb_tree<testinator::Test*,std::pair<testinator::Test*const,std::__cxx11::string>,std::_Select1st<std::pair<testinator::Test*const,std::__cxx11::string>>,std::less<testinator::Test*>,std::allocator<std::pair<testinator::Test*const,std::__cxx11::string>>>
  ::_M_insert_unique<std::pair<testinator::Test*const,std::__cxx11::string>>
            ((_Rb_tree<testinator::Test*,std::pair<testinator::Test*const,std::__cxx11::string>,std::_Select1st<std::pair<testinator::Test*const,std::__cxx11::string>>,std::less<testinator::Test*>,std::allocator<std::pair<testinator::Test*const,std::__cxx11::string>>>
              *)&this->m_testNames,
             (pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_13b8);
  if ((_func_result_type_void_ptr *)local_13b8._8_8_ != p_Var1) {
    operator_delete((void *)local_13b8._8_8_,local_13a0[0]._0_8_ + 1);
  }
  this_00 = &this->m_testsBySuite;
  local_13b8._0_8_ = local_13a8;
  pcVar2 = (suiteName->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_13b8,pcVar2,pcVar2 + suiteName->_M_string_length);
  local_13a0[0]._8_8_ = test;
  pVar6 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          ::_M_get_insert_equal_pos(&this_00->_M_t,(key_type *)local_13b8);
  local_13c0._M_t = &this_00->_M_t;
  ::std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
  ::
  _M_insert_<std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>::_Alloc_node>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
              *)this_00,pVar6.first,pVar6.second,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
              *)local_13b8,&local_13c0);
  if ((undefined1 *)local_13b8._0_8_ != local_13a8) {
    operator_delete((void *)local_13b8._0_8_,(long)local_13a8 + 1);
  }
  pcVar2 = (suiteName->_M_dataplus)._M_p;
  local_13b8._0_8_ = test;
  local_13b8._8_8_ = p_Var1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_13b8 + 8),pcVar2,pcVar2 + suiteName->_M_string_length);
  ::std::
  _Rb_tree<testinator::Test*,std::pair<testinator::Test*const,std::__cxx11::string>,std::_Select1st<std::pair<testinator::Test*const,std::__cxx11::string>>,std::less<testinator::Test*>,std::allocator<std::pair<testinator::Test*const,std::__cxx11::string>>>
  ::_M_insert_unique<std::pair<testinator::Test*const,std::__cxx11::string>>
            ((_Rb_tree<testinator::Test*,std::pair<testinator::Test*const,std::__cxx11::string>,std::_Select1st<std::pair<testinator::Test*const,std::__cxx11::string>>,std::less<testinator::Test*>,std::allocator<std::pair<testinator::Test*const,std::__cxx11::string>>>
              *)&this->m_suiteNames,
             (pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_13b8);
  if ((_func_result_type_void_ptr *)local_13b8._8_8_ != p_Var1) {
    operator_delete((void *)local_13b8._8_8_,local_13a0[0]._0_8_ + 1);
  }
  ::std::random_device::random_device((random_device *)local_13b8);
  uVar3 = ::std::random_device::_M_getval();
  uVar5 = (ulong)uVar3;
  (this->m_generator)._M_x[0] = uVar5;
  lVar4 = 0x19;
  do {
    uVar5 = (ulong)((((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar4) - 0x18);
    *(ulong *)(&(this->m_tests)._M_t._M_impl.field_0x0 + lVar4 * 8) = uVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x288);
  (this->m_generator)._M_p = 0x270;
  ::std::random_device::_M_fini();
  return;
}

Assistant:

void Register(Test* test,
                  const std::string& testName,
                  const std::string& suiteName)
    {
      m_tests.insert({testName, test});
      m_testNames.insert({test, testName});

      m_testsBySuite.insert({suiteName, test});
      m_suiteNames.insert({test, suiteName});

      std::random_device rd;
      m_generator.seed(rd());
    }